

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int nn_pipebase_start(nn_pipebase *self)

{
  int iVar1;
  int extraout_EAX;
  
  if (self->state == '\x01') {
    self->state = '\x02';
    self->instate = '\x04';
    self->outstate = '\x01';
    iVar1 = nn_sock_add(self->sock,(nn_pipe *)self);
    if (-1 < iVar1) {
      nn_fsm_raise(&self->fsm,&self->out,0x84c4);
      return 0;
    }
  }
  else {
    nn_pipebase_start_cold_1();
    iVar1 = extraout_EAX;
  }
  self->state = '\x03';
  return iVar1;
}

Assistant:

int nn_pipebase_start (struct nn_pipebase *self)
{
    int rc;

    nn_assert_state (self, NN_PIPEBASE_STATE_IDLE);

    self->state = NN_PIPEBASE_STATE_ACTIVE;
    self->instate = NN_PIPEBASE_INSTATE_ASYNC;
    self->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
    rc = nn_sock_add (self->sock, (struct nn_pipe*) self);
    if (nn_slow (rc < 0)) {
        self->state = NN_PIPEBASE_STATE_FAILED;
        return rc;
    }
    nn_fsm_raise (&self->fsm, &self->out, NN_PIPE_OUT);

    return 0;
}